

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O2

asn_enc_rval_t *
INTEGER_encode_xer(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                  int ilevel,xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  ssize_t sVar1;
  
  if (((sptr != (void *)0x0) && (*sptr != 0)) &&
     (sVar1 = INTEGER__dump(td,(INTEGER_t *)sptr,cb,app_key,1), -1 < sVar1)) {
    __return_storage_ptr__->encoded = sVar1;
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
  __return_storage_ptr__->structure_ptr = sptr;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const INTEGER_t *st = (const INTEGER_t *)sptr;
	asn_enc_rval_t er;

	(void)ilevel;
	(void)flags;
	
	if(!st || !st->buf)
		ASN__ENCODE_FAILED;

	er.encoded = INTEGER__dump(td, st, cb, app_key, 1);
	if(er.encoded < 0) ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}